

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O3

int mbedtls_cipher_auth_decrypt
              (mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len,uchar *ad,size_t ad_len,
              uchar *input,size_t ilen,uchar *output,size_t *olen,uchar *tag,size_t tag_len)

{
  mbedtls_cipher_mode_t mVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  mVar1 = ctx->cipher_info->mode;
  if (mVar1 == MBEDTLS_MODE_CCM) {
    *olen = ilen;
    iVar2 = mbedtls_ccm_auth_decrypt
                      ((mbedtls_ccm_context *)ctx->cipher_ctx,ilen,iv,iv_len,ad,ad_len,input,output,
                       tag,tag_len);
    bVar4 = iVar2 == -0xf;
  }
  else {
    if (mVar1 != MBEDTLS_MODE_GCM) {
      return -0x6080;
    }
    *olen = ilen;
    iVar2 = mbedtls_gcm_auth_decrypt
                      ((mbedtls_gcm_context *)ctx->cipher_ctx,ilen,iv,iv_len,ad,ad_len,tag,tag_len,
                       input,output);
    bVar4 = iVar2 == -0x12;
  }
  iVar3 = -0x6300;
  if (!bVar4) {
    iVar3 = iVar2;
  }
  return iVar3;
}

Assistant:

int mbedtls_cipher_auth_decrypt( mbedtls_cipher_context_t *ctx,
                         const unsigned char *iv, size_t iv_len,
                         const unsigned char *ad, size_t ad_len,
                         const unsigned char *input, size_t ilen,
                         unsigned char *output, size_t *olen,
                         const unsigned char *tag, size_t tag_len )
{
#if defined(MBEDTLS_GCM_C)
    if( MBEDTLS_MODE_GCM == ctx->cipher_info->mode )
    {
        int ret;

        *olen = ilen;
        ret = mbedtls_gcm_auth_decrypt( ctx->cipher_ctx, ilen,
                                iv, iv_len, ad, ad_len,
                                tag, tag_len, input, output );

        if( ret == MBEDTLS_ERR_GCM_AUTH_FAILED )
            ret = MBEDTLS_ERR_CIPHER_AUTH_FAILED;

        return( ret );
    }
#endif /* MBEDTLS_GCM_C */
#if defined(MBEDTLS_CCM_C)
    if( MBEDTLS_MODE_CCM == ctx->cipher_info->mode )
    {
        int ret;

        *olen = ilen;
        ret = mbedtls_ccm_auth_decrypt( ctx->cipher_ctx, ilen,
                                iv, iv_len, ad, ad_len,
                                input, output, tag, tag_len );

        if( ret == MBEDTLS_ERR_CCM_AUTH_FAILED )
            ret = MBEDTLS_ERR_CIPHER_AUTH_FAILED;

        return( ret );
    }
#endif /* MBEDTLS_CCM_C */

    return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
}